

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testWrite(DataFileTest *this)

{
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long lVar1;
  long lVar2;
  DataFileWriter<Complex<long>_> df;
  ComplexInteger c;
  
  __n = 100;
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            (&df,this->filename,&this->writerSchema,100,NULL_CODEC);
  lVar1 = 3;
  __buf = extraout_RDX;
  for (lVar2 = 5; (int)lVar2 != 0xbbd; lVar2 = lVar2 + 3) {
    c.re = lVar1;
    c.im = lVar2;
    avro::DataFileWriter<Complex<long>_>::write(&df,(int)&c,__buf,__n);
    lVar1 = lVar1 * lVar2;
    __buf = extraout_RDX_00;
  }
  avro::DataFileWriterBase::close();
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&df.base_);
  return;
}

Assistant:

void testWrite() {
        avro::DataFileWriter<ComplexInteger> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            ComplexInteger c(re, im);
            df.write(c);
        }
        df.close();
    }